

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::FileDescriptorTables::AddEnumValueByNumber
          (FileDescriptorTables *this,EnumValueDescriptor *value)

{
  int iVar1;
  int iVar2;
  EnumDescriptor *pEVar3;
  EnumValueDescriptor *this_00;
  long lVar4;
  pair<std::__detail::_Node_iterator<google::protobuf::Symbol,_true,_true>,_bool> pVar5;
  value_type local_40 [3];
  int local_24;
  EnumValueDescriptor *pEStack_20;
  int base;
  EnumValueDescriptor *value_local;
  FileDescriptorTables *this_local;
  
  pEStack_20 = value;
  value_local = (EnumValueDescriptor *)this;
  pEVar3 = EnumValueDescriptor::type(value);
  this_00 = EnumDescriptor::value(pEVar3,0);
  iVar1 = EnumValueDescriptor::number(this_00);
  local_24 = iVar1;
  iVar2 = EnumValueDescriptor::number(pEStack_20);
  if (iVar1 <= iVar2) {
    iVar1 = EnumValueDescriptor::number(pEStack_20);
    lVar4 = (long)local_24;
    pEVar3 = EnumValueDescriptor::type(pEStack_20);
    if ((long)iVar1 <= lVar4 + *(short *)(pEVar3 + 2)) {
      return true;
    }
  }
  local_40[0].ptr_ = (SymbolBase *)Symbol::EnumValue(pEStack_20,0);
  pVar5 = std::
          unordered_set<google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::FieldsByNumberHash,_google::protobuf::(anonymous_namespace)::FieldsByNumberEq,_std::allocator<google::protobuf::Symbol>_>
          ::insert(&this->enum_values_by_number_,local_40);
  return (bool)(pVar5.second & 1);
}

Assistant:

bool FileDescriptorTables::AddEnumValueByNumber(EnumValueDescriptor* value) {
  // Skip values that are at the start of the sequence.
  const int base = value->type()->value(0)->number();
  if (base <= value->number() &&
      value->number() <=
          static_cast<int64_t>(base) + value->type()->sequential_value_limit_)
    return true;
  return enum_values_by_number_.insert(Symbol::EnumValue(value, 0)).second;
}